

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Node::traverseAnnotations
          (Node *this,Reader *annotations,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ElementCount EVar1;
  ElementCount index;
  Reader annotation;
  undefined1 local_68 [56];
  
  EVar1 = (annotations->reader).elementCount;
  if (EVar1 != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement
                ((StructReader *)(local_68 + 8),&annotations->reader,index);
      Impl::findNode((Impl *)local_68,(uint64_t)this->module->compiler);
      if ((Node *)local_68._0_8_ != (Node *)0x0) {
        traverse((Node *)local_68._0_8_,eagerness,seen,finalLoader,sourceInfo);
      }
      index = index + 1;
    } while (EVar1 != index);
  }
  return;
}

Assistant:

void Compiler::Node::traverseAnnotations(const List<schema::Annotation>::Reader& annotations,
                                         uint eagerness,
                                         std::unordered_map<Node*, uint>& seen,
                                         const SchemaLoader& finalLoader,
                                         kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto annotation: annotations) {
    KJ_IF_SOME(node, module->getCompiler().findNode(annotation.getId())) {
      node.traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }
}